

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap.h
# Opt level: O2

void __thiscall
Minisat::Heap<Minisat::Solver::VarOrderLt>::percolateDown
          (Heap<Minisat::Solver::VarOrderLt> *this,int i)

{
  int iVar1;
  int iVar2;
  vec<double> *pvVar3;
  int *piVar4;
  int *piVar5;
  double *pdVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  double dVar11;
  
  pvVar3 = (this->lt).activity;
  piVar4 = (this->heap).data;
  iVar1 = piVar4[i];
  piVar5 = (this->indices).data;
  while( true ) {
    iVar8 = i * 2 + 1;
    iVar9 = (this->heap).sz;
    if (iVar9 <= iVar8) break;
    iVar7 = i * 2 + 2;
    if (iVar7 < iVar9) {
      iVar2 = piVar4[iVar7];
      iVar9 = piVar4[iVar8];
      pdVar6 = pvVar3->data;
      lVar10 = (long)iVar9;
      dVar11 = pdVar6[iVar9];
      if (pdVar6[iVar9] < pdVar6[iVar2]) {
        lVar10 = (long)iVar2;
        dVar11 = pdVar6[iVar2];
        iVar8 = iVar7;
        iVar9 = iVar2;
      }
    }
    else {
      iVar9 = piVar4[iVar8];
      pdVar6 = pvVar3->data;
      lVar10 = (long)iVar9;
      dVar11 = pdVar6[lVar10];
    }
    if (dVar11 < pdVar6[iVar1] || dVar11 == pdVar6[iVar1]) break;
    piVar4[i] = iVar9;
    piVar5[lVar10] = i;
    i = iVar8;
  }
  piVar4[i] = iVar1;
  piVar5[iVar1] = i;
  return;
}

Assistant:

void percolateDown(int i)
    {
        int x = heap[i];
        while (left(i) < heap.size()) {
            int child = right(i) < heap.size() && lt(heap[right(i)], heap[left(i)]) ? right(i) : left(i);
            if (!lt(heap[child], x)) break;
            heap[i] = heap[child];
            indices[heap[i]] = i;
            i = child;
        }
        heap[i] = x;
        indices[x] = i;
    }